

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O0

char * blogc_slugify(char *str)

{
  long local_30;
  size_t i;
  int diff;
  char *new_str;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    str_local = bc_strdup(str);
    for (local_30 = 0; str_local[local_30] != '\0'; local_30 = local_30 + 1) {
      if (((str_local[local_30] < 'a') || ('z' < str_local[local_30])) &&
         ((str_local[local_30] < '0' || ('9' < str_local[local_30])))) {
        if ((str_local[local_30] < 'A') || ('Z' < str_local[local_30])) {
          str_local[local_30] = '-';
        }
        else {
          str_local[local_30] = str_local[local_30] + ' ';
        }
      }
    }
  }
  return str_local;
}

Assistant:

char*
blogc_slugify(const char *str)
{
    if (str == NULL)
        return NULL;
    char *new_str = bc_strdup(str);
    int diff = 'a' - 'A';  // just to avoid magic numbers
    for (size_t i = 0; new_str[i] != '\0'; i++) {
        if (new_str[i] >= 'a' && new_str[i] <= 'z')
            continue;
        if (new_str[i] >= '0' && new_str[i] <= '9')
            continue;
        if (new_str[i] >= 'A' && new_str[i] <= 'Z')
            new_str[i] += diff;
        else
            new_str[i] = '-';
    }
    return new_str;
}